

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void ARGBToARGB1555Row_C(uint8_t *src_argb,uint8_t *dst_rgb,int width)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [13];
  int iVar6;
  undefined1 auVar7 [15];
  
  if (1 < width) {
    iVar6 = 0;
    do {
      *(uint *)dst_rgb =
           (src_argb[7] & 0xffffff80) << 0x18 | (src_argb[6] & 0xf8) << 0x17 |
           (src_argb[5] & 0xf8) << 0x12 |
           (src_argb[4] & 0xf8) << 0xd |
           (src_argb[3] & 0x80) << 8 |
           (src_argb[2] & 0xf8) << 7 | (uint)(*src_argb >> 3) + (src_argb[1] & 0xf8) * 4;
      dst_rgb = (uint8_t *)((long)dst_rgb + 4);
      src_argb = src_argb + 8;
      iVar6 = iVar6 + 2;
    } while (iVar6 < width + -1);
  }
  if ((width & 1U) != 0) {
    auVar7 = ZEXT215(*(ushort *)(src_argb + 1) >> 3) & DAT_004c8080._0_15_;
    auVar1._8_7_ = 0;
    auVar1._0_8_ = SUB158(ZEXT115(0) << 0x40,7);
    auVar2._9_6_ = 0;
    auVar2._0_9_ = SUB159(auVar1 << 0x38,6);
    auVar3._10_5_ = 0;
    auVar3._0_10_ = SUB1510(auVar2 << 0x30,5);
    auVar4._11_4_ = 0;
    auVar4._0_11_ = SUB1511(auVar3 << 0x28,4);
    auVar5._1_12_ = SUB1512(auVar4 << 0x20,3);
    auVar5[0] = auVar7[1];
    *(ushort *)dst_rgb =
         (src_argb[3] & 0x80) << 8 |
         auVar5._0_2_ * 0x400 | (ushort)auVar7[0] * 0x20 | (ushort)(*src_argb >> 3);
  }
  return;
}

Assistant:

void ARGBToARGB1555Row_C(const uint8_t* src_argb, uint8_t* dst_rgb, int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    uint8_t b0 = src_argb[0] >> 3;
    uint8_t g0 = src_argb[1] >> 3;
    uint8_t r0 = src_argb[2] >> 3;
    uint8_t a0 = src_argb[3] >> 7;
    uint8_t b1 = src_argb[4] >> 3;
    uint8_t g1 = src_argb[5] >> 3;
    uint8_t r1 = src_argb[6] >> 3;
    uint8_t a1 = src_argb[7] >> 7;
    *(uint32_t*)(dst_rgb) = b0 | (g0 << 5) | (r0 << 10) | (a0 << 15) |
                            (b1 << 16) | (g1 << 21) | (r1 << 26) | (a1 << 31);
    dst_rgb += 4;
    src_argb += 8;
  }
  if (width & 1) {
    uint8_t b0 = src_argb[0] >> 3;
    uint8_t g0 = src_argb[1] >> 3;
    uint8_t r0 = src_argb[2] >> 3;
    uint8_t a0 = src_argb[3] >> 7;
    *(uint16_t*)(dst_rgb) = b0 | (g0 << 5) | (r0 << 10) | (a0 << 15);
  }
}